

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void vera::sdf(Image *_image)

{
  float fVar1;
  int iVar2;
  uint n;
  uint n_00;
  int iVar3;
  ostream *poVar4;
  float *f;
  undefined4 extraout_var;
  float *pfVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int y;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int y_1;
  ulong uVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double extraout_XMM0_Qa_01;
  
  iVar2 = (*_image->_vptr_Image[8])();
  if (1 < iVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"We need a one channel image to compute an SDF");
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  }
  n = (*_image->_vptr_Image[6])(_image);
  n_00 = (*_image->_vptr_Image[7])(_image);
  uVar6 = n_00;
  if ((int)n_00 < (int)n) {
    uVar6 = n;
  }
  uVar8 = 0xffffffffffffffff;
  if (-1 < (int)uVar6) {
    uVar8 = (ulong)uVar6 * 4;
  }
  f = (float *)operator_new__(uVar8);
  uVar6 = n_00;
  if ((int)n_00 < 1) {
    uVar6 = 0;
  }
  uVar8 = (ulong)uVar6;
  uVar10 = (ulong)n;
  if ((int)n < 1) {
    uVar10 = 0;
  }
  __x = extraout_XMM0_Qa;
  for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    uVar6 = (uint)uVar11;
    uVar9 = uVar11 & 0xffffffff;
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      iVar2 = (*_image->_vptr_Image[0xc])(_image,uVar9);
      f[uVar7] = *(float *)CONCAT44(extraout_var,iVar2);
      uVar9 = (ulong)((int)uVar9 + n);
    }
    pfVar5 = dt(f,n_00);
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      fVar1 = pfVar5[uVar7];
      iVar2 = (*_image->_vptr_Image[0xc])(_image,(ulong)uVar6);
      *(float *)CONCAT44(extraout_var_00,iVar2) = fVar1;
      uVar6 = uVar6 + n;
    }
    operator_delete__(pfVar5);
    __x = extraout_XMM0_Qa_00;
  }
  iVar2 = 0;
  for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      iVar3 = (*_image->_vptr_Image[0xc])(_image,(ulong)(uint)((int)uVar7 + iVar2));
      f[uVar7] = *(float *)CONCAT44(extraout_var_01,iVar3);
    }
    pfVar5 = dt(f,n);
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      fVar1 = pfVar5[uVar7];
      iVar3 = (*_image->_vptr_Image[0xc])(_image,(ulong)(uint)((int)uVar7 + iVar2));
      *(float *)CONCAT44(extraout_var_02,iVar3) = fVar1;
    }
    operator_delete__(pfVar5);
    iVar2 = iVar2 + n;
    __x = extraout_XMM0_Qa_01;
  }
  sqrt(__x);
  autolevel(_image);
  operator_delete__(f);
  return;
}

Assistant:

void sdf(Image& _image) {
    if (_image.getChannels() > 1) {
        std::cout << "We need a one channel image to compute an SDF" << std::endl;
        return;
    }

    int width = _image.getWidth();
    int height = _image.getHeight();
    float *f = new float[std::max(width, height)];

    // transform along columns
    for (int x = 0; x < width; x++) {
        for (int y = 0; y < height; y++)
            f[y] = _image[y * width + x];
        
        float *d = dt(f, height);
        for (int y = 0; y < height; y++) 
            _image[y * width + x] = d[y];

        delete [] d;
    }

    // transform along rows
    for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++)
            f[x] = _image[y * width + x];
        
        float *d = dt(f, width);
        for (int x = 0; x < width; x++)
            _image[y * width + x] = d[x];
            
        delete [] d;
    }

    sqrt(_image);
    autolevel(_image);

    delete [] f;
}